

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  undefined8 uVar1;
  int iVar2;
  byte *in_00;
  byte *out_00;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  uchar tmpiv [8];
  uchar *iv;
  ossl_gost_cipher_ctx *c;
  int i;
  uchar *out_ptr;
  uchar *in_ptr;
  uchar b [8];
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 *local_38;
  undefined8 *local_30;
  byte local_28 [8];
  long local_20;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  in_00 = (byte *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  out_00 = (byte *)EVP_CIPHER_CTX_iv_noconst(local_8);
  iVar2 = EVP_CIPHER_CTX_is_encrypting(local_8);
  local_38 = in_RSI;
  local_30 = in_RDX;
  if (iVar2 == 0) {
    for (; local_20 != 0; local_20 = local_20 + -8) {
      gostdecrypt((gost_ctx *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_00,
                  out_00);
      uVar1 = *local_30;
      for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < 8;
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
        *(byte *)((long)local_38 + (long)in_stack_ffffffffffffffc4) =
             out_00[in_stack_ffffffffffffffc4] ^ local_28[in_stack_ffffffffffffffc4];
      }
      *(undefined8 *)out_00 = uVar1;
      local_38 = local_38 + 1;
      local_30 = local_30 + 1;
    }
  }
  else {
    for (; local_20 != 0; local_20 = local_20 + -8) {
      for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
        local_28[iVar2] = out_00[iVar2] ^ *(byte *)((long)local_30 + (long)iVar2);
      }
      gostcrypt((gost_ctx *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_00,out_00);
      *(undefined8 *)out_00 = *local_38;
      local_38 = local_38 + 1;
      local_30 = local_30 + 1;
    }
  }
  return 1;
}

Assistant:

static int gost_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                       const unsigned char *in, size_t inl)
{
    unsigned char b[8];
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    int i;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        while (inl > 0) {

            for (i = 0; i < 8; i++) {
                b[i] = iv[i] ^ in_ptr[i];
            }
            gostcrypt(&(c->cctx), b, out_ptr);
            memcpy(iv, out_ptr, 8);
            out_ptr += 8;
            in_ptr += 8;
            inl -= 8;
        }
    } else {
        while (inl > 0) {
            unsigned char tmpiv[8];
            gostdecrypt(&(c->cctx), in_ptr, b);
            memcpy(tmpiv, in_ptr, 8);
            for (i = 0; i < 8; i++) {
                out_ptr[i] = iv[i] ^ b[i];
            }
            memcpy(iv, tmpiv, 8);
            out_ptr += 8;
            in_ptr += 8;
            inl -= 8;
        }
    }
    return 1;
}